

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

void __thiscall
solitaire::SolitaireEmptyHandTest::ignoreEmptyHandPossibleOperationsTest
          (SolitaireEmptyHandTest *this)

{
  StrictMock<solitaire::archivers::HistoryTrackerMock> *pSVar1;
  MockSpec<unsigned_int_()> *this_00;
  TypedExpectation<unsigned_int_()> *this_01;
  MockSpec<void_()> *pMVar2;
  TypedExpectation<void_()> *pTVar3;
  MockSpec<std::optional<solitaire::cards::Card>_()> *pMVar4;
  TypedExpectation<std::optional<solitaire::cards::Card>_()> *pTVar5;
  MockSpec<bool_()> *this_02;
  TypedExpectation<bool_()> *this_03;
  MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  *this_04;
  TypedExpectation<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  *this_05;
  element_type *peVar6;
  MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_06;
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_07;
  HistoryTrackerMock *in_RSI;
  HistoryTrackerMock *this_08;
  FoundationPileMock *this_09;
  TableauPileMock *pTVar7;
  StockPileMock *pSVar8;
  mock_ptr<testing::StrictMock<solitaire::archivers::HistoryTrackerMock>_> *this_10;
  PileId local_120;
  PileId local_11c;
  PileId local_118;
  WithoutMatchers local_111;
  MockSpec<std::optional<solitaire::cards::Card>_()> local_110;
  WithoutMatchers local_f9;
  MockSpec<void_()> local_f8;
  WithoutMatchers local_e1;
  MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  local_e0;
  WithoutMatchers local_cd [13];
  Matcher<unsigned_int> local_c0;
  MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  local_a8;
  WithoutMatchers local_81;
  MockSpec<void_()> local_80;
  WithoutMatchers local_69;
  MockSpec<bool_()> local_68;
  WithoutMatchers local_51;
  MockSpec<std::optional<solitaire::cards::Card>_()> local_50;
  WithoutMatchers local_39;
  MockSpec<void_()> local_38;
  WithoutMatchers local_21;
  MockSpec<unsigned_int_()> local_20;
  SolitaireEmptyHandTest *local_10;
  SolitaireEmptyHandTest *this_local;
  
  this_10 = &(this->super_SolitaireTest).historyTrackerMock;
  local_10 = this;
  pSVar1 = mock_ptr<testing::StrictMock<solitaire::archivers::HistoryTrackerMock>_>::operator*
                     (this_10);
  local_20.function_mocker_ =
       (FunctionMocker<unsigned_int_()> *)
       archivers::HistoryTrackerMock::gmock_getHistorySize
                 ((MockSpec<unsigned_int_()> *)pSVar1,in_RSI);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<unsigned_int_()>::operator()
                      (&local_20,&local_21,(void *)0x0);
  this_01 = testing::internal::MockSpec<unsigned_int_()>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0xaf,"*historyTrackerMock","getHistorySize()");
  this_08 = (HistoryTrackerMock *)0x0;
  testing::internal::TypedExpectation<unsigned_int_()>::Times(this_01,0);
  pSVar1 = mock_ptr<testing::StrictMock<solitaire::archivers::HistoryTrackerMock>_>::operator*
                     (this_10);
  local_38.function_mocker_ =
       (FunctionMocker<void_()> *)
       archivers::HistoryTrackerMock::gmock_undo((MockSpec<void_()> *)pSVar1,this_08);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<void_()>::operator()(&local_38,&local_39,(void *)0x0);
  pTVar3 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                      ,0xb0,"*historyTrackerMock","undo()");
  this_09 = (FoundationPileMock *)0x0;
  testing::internal::TypedExpectation<void_()>::Times(pTVar3,0);
  local_50.function_mocker_ =
       (FunctionMocker<std::optional<solitaire::cards::Card>_()> *)
       piles::FoundationPileMock::gmock_tryPullOutCard
                 ((MockSpec<std::optional<solitaire::cards::Card>_()> *)
                  (this->super_SolitaireTest).lastFoundationPileMock,this_09);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<std::optional<solitaire::cards::Card>_()>::operator()
                     (&local_50,&local_51,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<std::optional<solitaire::cards::Card>_()>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                      ,0xb1,"lastFoundationPileMock","tryPullOutCard()");
  pTVar7 = (TableauPileMock *)0x0;
  testing::internal::TypedExpectation<std::optional<solitaire::cards::Card>_()>::Times(pTVar5,0);
  local_68.function_mocker_ =
       (FunctionMocker<bool_()> *)
       piles::TableauPileMock::gmock_isTopCardCovered
                 ((MockSpec<bool_()> *)(this->super_SolitaireTest).lastTableauPileMock,pTVar7);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<bool_()>::operator()(&local_68,&local_69,(void *)0x0);
  this_03 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0xb2,"lastTableauPileMock","isTopCardCovered()");
  pTVar7 = (TableauPileMock *)0x0;
  testing::internal::TypedExpectation<bool_()>::Times(this_03,0);
  local_80.function_mocker_ =
       (FunctionMocker<void_()> *)
       piles::TableauPileMock::gmock_tryUncoverTopCard
                 ((MockSpec<void_()> *)(this->super_SolitaireTest).lastTableauPileMock,pTVar7);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<void_()>::operator()(&local_80,&local_81,(void *)0x0);
  pTVar3 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                      ,0xb3,"lastTableauPileMock","tryUncoverTopCard()");
  testing::internal::TypedExpectation<void_()>::Times(pTVar3,0);
  pTVar7 = (this->super_SolitaireTest).lastTableauPileMock;
  testing::Matcher<unsigned_int>::Matcher<testing::internal::AnythingMatcher_const&,void>
            (&local_c0,(AnythingMatcher *)&testing::_);
  piles::TableauPileMock::gmock_tryPullOutCards(&local_a8,pTVar7,&local_c0);
  testing::internal::GetWithoutMatchers();
  this_04 = testing::internal::
            MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
            ::operator()(&local_a8,local_cd,(void *)0x0);
  this_05 = testing::internal::
            MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
            ::InternalExpectedAt
                      (this_04,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0xb4,"lastTableauPileMock","tryPullOutCards(_)");
  pSVar8 = (StockPileMock *)0x0;
  testing::internal::
  TypedExpectation<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::Times(this_05,0);
  testing::internal::
  MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::~MockSpec(&local_a8);
  testing::Matcher<unsigned_int>::~Matcher(&local_c0);
  peVar6 = std::
           __shared_ptr_access<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&(this->super_SolitaireTest).stockPileMock);
  local_e0.function_mocker_ =
       (FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
        *)piles::StockPileMock::gmock_getCards
                    ((MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                      *)peVar6,pSVar8);
  testing::internal::GetWithoutMatchers();
  this_06 = testing::internal::
            MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            ::operator()(&local_e0,&local_e1,(void *)0x0);
  this_07 = testing::internal::
            MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            ::InternalExpectedAt
                      (this_06,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0xb5,"*stockPileMock","getCards()");
  pSVar8 = (StockPileMock *)0x0;
  testing::internal::
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  ::Times(this_07,0);
  peVar6 = std::
           __shared_ptr_access<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&(this->super_SolitaireTest).stockPileMock);
  local_f8.function_mocker_ =
       (FunctionMocker<void_()> *)
       piles::StockPileMock::gmock_trySelectNextCard((MockSpec<void_()> *)peVar6,pSVar8);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<void_()>::operator()(&local_f8,&local_f9,(void *)0x0);
  pTVar3 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                      ,0xb6,"*stockPileMock","trySelectNextCard()");
  pSVar8 = (StockPileMock *)0x0;
  testing::internal::TypedExpectation<void_()>::Times(pTVar3,0);
  peVar6 = std::
           __shared_ptr_access<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&(this->super_SolitaireTest).stockPileMock);
  local_110.function_mocker_ =
       (FunctionMocker<std::optional<solitaire::cards::Card>_()> *)
       piles::StockPileMock::gmock_tryPullOutCard
                 ((MockSpec<std::optional<solitaire::cards::Card>_()> *)peVar6,pSVar8);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<std::optional<solitaire::cards::Card>_()>::operator()
                     (&local_110,&local_111,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<std::optional<solitaire::cards::Card>_()>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                      ,0xb7,"*stockPileMock","tryPullOutCard()");
  testing::internal::TypedExpectation<std::optional<solitaire::cards::Card>_()>::Times(pTVar5,0);
  Solitaire::tryUndoOperation(&(this->super_SolitaireTest).solitaire);
  piles::PileId::PileId(&local_118,(PileId *)&(anonymous_namespace)::lastFoundationPileId);
  Solitaire::tryPullOutCardFromFoundationPile(&(this->super_SolitaireTest).solitaire,&local_118);
  piles::PileId::PileId(&local_11c,(PileId *)&(anonymous_namespace)::lastTableauPileId);
  Solitaire::tryUncoverTableauPileTopCard(&(this->super_SolitaireTest).solitaire,&local_11c);
  piles::PileId::PileId(&local_120,(PileId *)&(anonymous_namespace)::lastTableauPileId);
  Solitaire::tryPullOutCardsFromTableauPile(&(this->super_SolitaireTest).solitaire,&local_120,2);
  Solitaire::trySelectNextStockPileCard(&(this->super_SolitaireTest).solitaire);
  Solitaire::tryPullOutCardFromStockPile(&(this->super_SolitaireTest).solitaire);
  return;
}

Assistant:

void ignoreEmptyHandPossibleOperationsTest() {
        EXPECT_CALL(*historyTrackerMock, getHistorySize()).Times(0);
        EXPECT_CALL(*historyTrackerMock, undo()).Times(0);
        EXPECT_CALL(lastFoundationPileMock, tryPullOutCard()).Times(0);
        EXPECT_CALL(lastTableauPileMock, isTopCardCovered()).Times(0);
        EXPECT_CALL(lastTableauPileMock, tryUncoverTopCard()).Times(0);
        EXPECT_CALL(lastTableauPileMock, tryPullOutCards(_)).Times(0);
        EXPECT_CALL(*stockPileMock, getCards()).Times(0);
        EXPECT_CALL(*stockPileMock, trySelectNextCard()).Times(0);
        EXPECT_CALL(*stockPileMock, tryPullOutCard()).Times(0);

        solitaire.tryUndoOperation();
        solitaire.tryPullOutCardFromFoundationPile(lastFoundationPileId);
        solitaire.tryUncoverTableauPileTopCard(lastTableauPileId);
        solitaire.tryPullOutCardsFromTableauPile(lastTableauPileId, quantityToPullOut);
        solitaire.trySelectNextStockPileCard();
        solitaire.tryPullOutCardFromStockPile();
    }